

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ronan.cpp
# Opt level: O0

void __thiscall
Ronan::syWRonan::SetFrame(syWRonan *this,Phoneme *p1s,Phoneme *p2s,float x,syVRonan *dest)

{
  ResDef *this_00;
  float fVar1;
  float bw;
  float gain;
  float fVar2;
  int local_24c;
  int i;
  float *p2a [7];
  float *p2b [7];
  float *p2f [7];
  float *p1a [7];
  float *p1b [7];
  float *p1f [7];
  float local_c8;
  float fStack_c4;
  Phoneme p2;
  Phoneme p1;
  syVRonan *dest_local;
  float x_local;
  Phoneme *p2s_local;
  Phoneme *p1s_local;
  syWRonan *this_local;
  
  p1f[0] = &p2.duration;
  p1f[1] = &p1.f1f;
  p1f[2] = &p1.f2f;
  p1f[3] = (float *)&f4;
  p1f[4] = (float *)&f5;
  p1f[5] = (float *)&f6;
  p1b[0] = &p2.rank;
  p1b[1] = &p1.f1b;
  p1b[2] = &p1.f2b;
  p1b[3] = (float *)&b4;
  p1b[4] = (float *)&b5;
  p1b[5] = (float *)&b6;
  p1a[0] = &p1.a_frication;
  p1a[1] = &p1.a_bypass;
  p1a[2] = &p1.a_1;
  p1a[3] = &p1.a_2;
  p1a[4] = &p1.a_4;
  p1a[5] = &p1.a_4;
  p2f[0] = &local_c8;
  p2f[1] = &p2.f1f;
  p2f[2] = &p2.f2f;
  p2f[3] = (float *)&f4;
  p2f[4] = (float *)&f5;
  p2f[5] = (float *)&f6;
  p2b[0] = &fStack_c4;
  p2b[1] = &p2.f1b;
  p2b[2] = &p2.f2b;
  p2b[3] = (float *)&b4;
  p2b[4] = (float *)&b5;
  p2b[5] = (float *)&b6;
  p2a[0] = &p2.a_frication;
  p2a[1] = &p2.a_bypass;
  p2a[2] = &p2.a_1;
  p2a[3] = &p2.a_2;
  p2a[4] = &p2.a_4;
  p2a[5] = &p2.a_4;
  p1._68_8_ = dest;
  memcpy(&p2.duration,p1s,0x4c);
  memcpy(&local_c8,p2s,0x4c);
  for (local_24c = 0; local_24c < 7; local_24c = local_24c + 1) {
    this_00 = (ResDef *)(p1._68_8_ + (long)local_24c * 0xc);
    fVar1 = flerp(*p1f[(long)local_24c + -1],*p2f[(long)local_24c + -1],x);
    fVar2 = this->pitch;
    bw = flerp(*p1b[(long)local_24c + -1],*p2b[(long)local_24c + -1],x);
    gain = db2lin(*p1a[(long)local_24c + -1],*p2a[(long)local_24c + -1],x);
    ResDef::set(this_00,fVar1 * fVar2,bw,gain);
  }
  fVar2 = db2lin(p1.f3b,p2.f3b,x);
  *(float *)(p1._68_8_ + 0x54) = fVar2;
  fVar2 = db2lin(p1.fnf,p2.fnf,x);
  *(float *)(p1._68_8_ + 0x58) = fVar2;
  fVar2 = db2lin(p1.a_voicing,p2.a_voicing,x);
  *(float *)(p1._68_8_ + 0x5c) = fVar2;
  fVar2 = db2lin(p1.a_aspiration,p2.a_aspiration,x);
  *(float *)(p1._68_8_ + 0x60) = fVar2;
  return;
}

Assistant:

void SetFrame(const Phoneme &p1s, const Phoneme &p2s, const float x, syVRonan &dest)
    {
        Phoneme p1,p2;

        const float * const p1f[] = { &p1.fnf, &p1.f1f, &p1.f2f, &p1.f3f, &f4    , &f5     , &f6};
        const float * const p1b[] = { &bn    , &p1.f1b, &p1.f2b, &p1.f3b, &b4    , &b5     , &b6};
        const float * const p1a[] = { &p1.a_n, &p1.a_1, &p1.a_2, &p1.a_3, &p1.a_4, &p1.a_56, &p1.a_56};

        const float * const p2f[] = { &p2.fnf, &p2.f1f, &p2.f2f, &p2.f3f, &f4    , &f5     , &f6};
        const float * const p2b[] = { &bn    , &p2.f1b, &p2.f2b, &p2.f3b, &b4    , &b5     , &b6};
        const float * const p2a[] = { &p2.a_n, &p2.a_1, &p2.a_2, &p2.a_3, &p2.a_4, &p2.a_56, &p2.a_56};

        p1 = p1s;
        p2 = p2s;

        for (int i = 0; i < 7; i++)
            dest.rdef[i].set(flerp(*p1f[i], *p2f[i], x)*pitch, flerp(*p1b[i], *p2b[i], x), db2lin(*p1a[i], *p2a[i], x));

        dest.a_voicing    = db2lin(p1.a_voicing, p2.a_voicing, x);
        dest.a_aspiration = db2lin(p1.a_aspiration, p2.a_aspiration, x);
        dest.a_frication  = db2lin(p1.a_frication, p2.a_frication, x);
        dest.a_bypass     = db2lin(p1.a_bypass, p2.a_bypass, x);
    }